

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChLinkRevoluteSpherical::Get_react_torque_body1(ChLinkRevoluteSpherical *this)

{
  double dVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  ChVector<double> *in_RDI;
  undefined1 auVar5 [16];
  
  auVar5._0_8_ = -(this->super_ChLink).react_torque.m_data[2];
  auVar5._8_4_ = 0;
  auVar5._12_4_ = 0x80000000;
  uVar2 = *(uint *)((long)(this->super_ChLink).react_torque.m_data + 4);
  uVar3 = *(undefined4 *)((this->super_ChLink).react_torque.m_data + 1);
  uVar4 = *(uint *)((long)(this->super_ChLink).react_torque.m_data + 0xc);
  *(undefined4 *)in_RDI->m_data = *(undefined4 *)(this->super_ChLink).react_torque.m_data;
  *(uint *)((long)in_RDI->m_data + 4) = uVar2 ^ 0x80000000;
  *(undefined4 *)(in_RDI->m_data + 1) = uVar3;
  *(uint *)((long)in_RDI->m_data + 0xc) = uVar4 ^ 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar5);
  in_RDI->m_data[2] = dVar1;
  return in_RDI;
}

Assistant:

ChVector<> ChLinkRevoluteSpherical::Get_react_torque_body1() {
    // Calculate the reaction forces on Body 1 in the joint frame
    // (Note: origin of the joint frame is at the center of the revolute joint
    //  which is defined on body 1, the x-axis is along the vector from the
    //  point on body 1 to the point on body 2.  The z axis is along the revolute
    //  axis defined for the joint)
    //  react_torque = (0,m_cur_dist*lam_dot,0)

    return -react_torque;
}